

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  bool bVar1;
  int local_4c;
  ImWchar local_48 [2];
  int i;
  ImWchar wchars [17];
  int wchars_buf_len;
  char *utf8_chars_local;
  ImGuiIO *this_local;
  
  ImTextStrFromUtf8(local_48,0x11,utf8_chars,(char *)0x0,(char **)0x0);
  local_4c = 0;
  while( true ) {
    bVar1 = false;
    if (local_4c < 0x11) {
      bVar1 = local_48[local_4c] != 0;
    }
    if (!bVar1) break;
    AddInputCharacter(this,local_48[local_4c]);
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    // We can't pass more wchars than ImGuiIO::InputCharacters[] can hold so don't convert more
    const int wchars_buf_len = sizeof(ImGuiIO::InputCharacters) / sizeof(ImWchar);
    ImWchar wchars[wchars_buf_len];
    ImTextStrFromUtf8(wchars, wchars_buf_len, utf8_chars, NULL);
    for (int i = 0; i < wchars_buf_len && wchars[i] != 0; i++)
        AddInputCharacter(wchars[i]);
}